

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wpd_node.cc
# Opt level: O0

int __thiscall webrtc::WPDNode::Update(WPDNode *this,float *parent_data,size_t parent_data_length)

{
  pointer pFVar1;
  pointer pfVar2;
  pointer out;
  size_t sVar3;
  type pfVar4;
  double dVar5;
  ulong local_40;
  size_t i;
  size_t output_samples;
  bool kOddSequence;
  size_t parent_data_length_local;
  float *parent_data_local;
  WPDNode *this_local;
  
  if ((parent_data == (float *)0x0) || (parent_data_length >> 1 != this->length_)) {
    this_local._4_4_ = -1;
  }
  else {
    pFVar1 = std::unique_ptr<webrtc::FIRFilter,_std::default_delete<webrtc::FIRFilter>_>::operator->
                       (&this->filter_);
    pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->data_);
    (*pFVar1->_vptr_FIRFilter[2])(pFVar1,parent_data,parent_data_length,pfVar2);
    pfVar2 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->data_);
    out = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->data_);
    sVar3 = DyadicDecimate<float>(pfVar2,parent_data_length,true,out,this->length_);
    if (sVar3 == this->length_) {
      for (local_40 = 0; local_40 < this->length_; local_40 = local_40 + 1) {
        pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           (&this->data_,local_40);
        dVar5 = std::fabs((double)(ulong)(uint)*pfVar4);
        pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                           (&this->data_,local_40);
        *pfVar4 = SUB84(dVar5,0);
      }
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int WPDNode::Update(const float* parent_data, size_t parent_data_length) {
  if (!parent_data || (parent_data_length / 2) != length_) {
    return -1;
  }

  // Filter data.
  filter_->Filter(parent_data, parent_data_length, data_.get());

  // Decimate data.
  const bool kOddSequence = true;
  size_t output_samples = DyadicDecimate(
      data_.get(), parent_data_length, kOddSequence, data_.get(), length_);
  if (output_samples != length_) {
    return -1;
  }

  // Get abs to all values.
  for (size_t i = 0; i < length_; ++i) {
    data_[i] = fabs(data_[i]);
  }

  return 0;
}